

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O3

char * google::protobuf::internal::TcParser::MpString<false>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  byte bVar1;
  ushort uVar2;
  byte *pbVar3;
  undefined1 auVar4 [12];
  bool bVar5;
  uint32_t has_idx;
  uint uVar6;
  char *pcVar7;
  TailCallParseFunc UNRECOVERED_JUMPTABLE;
  ushort *puVar8;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 cord;
  string *s;
  ulong uVar9;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 table_00;
  ParseContext *extraout_RDX;
  ParseContext *extraout_RDX_00;
  ParseContext *extraout_RDX_01;
  ParseContext *ctx_00;
  ParseContext *entry;
  ushort uVar10;
  TcParseTableBase *table_01;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 this;
  ParseContext *wire_bytes;
  uint16_t xform_val;
  uint64_t uVar11;
  uint *puVar12;
  pair<const_char_*,_int> pVar13;
  string_view wire_bytes_00;
  ushort local_54;
  anon_class_8_1_a7a63227 local_40;
  anon_class_8_1_a7a63227 local_38;
  
  table_00.data = (long)&table->has_bits_offset + ((ulong)data.field_0 >> 0x20);
  if ((table_00.data & 3) != 0) {
    AlignFail(table_00.data);
  }
  if ((data.field_0._0_4_ & 7) != 2) {
    UNRECOVERED_JUMPTABLE = table->fallback;
    goto LAB_0015725c;
  }
  uVar2 = *(ushort *)(table_00.data + 10);
  uVar10 = uVar2 & 0x30;
  if (uVar10 == 0x20) {
    pcVar7 = MpRepeatedString<false>(msg,ptr,ctx,data,table,hasbits);
    return pcVar7;
  }
  local_54 = uVar2 & 0x600;
  uVar11 = hasbits;
  if (uVar10 == 0x10) {
    pbVar3 = (byte *)((long)&msg->_vptr_MessageLite + ((long)(int)*(uint *)(table_00.data + 4) >> 3)
                     );
    *pbVar3 = *pbVar3 | '\x01' << (*(uint *)(table_00.data + 4) & 7);
LAB_001572b8:
    bVar5 = false;
  }
  else {
    if (uVar10 != 0x30) goto LAB_001572b8;
    data.field_0._0_4_ = data.field_0._0_4_ >> 3;
    data.field_0.data._4_4_ = 0;
    bVar5 = ChangeOneof(table,(FieldEntry *)table_00,data.field_0._0_4_,(ParseContext *)data.field_0
                        ,msg);
  }
  xform_val = (uint16_t)uVar11;
  if ((uVar2 & 0x1c0) == 0x80) {
    if (uVar10 == 0x30) {
      if (bVar5 == false) {
        this.data = (long)&msg->_vptr_MessageLite + (ulong)*(uint *)table_00;
        if ((this.data & 7) != 0) goto LAB_00157361;
        cord.data = *this.data;
      }
      else {
        local_40.arena = (Arena *)(msg->_internal_metadata_).ptr_;
        if (((ulong)local_40.arena & 1) != 0) {
          local_40.arena = *(Arena **)((ulong)local_40.arena & 0xfffffffffffffffe);
        }
        local_38.arena = local_40.arena;
        cord = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
               absl::lts_20240722::utility_internal::
               IfConstexprElse<false,google::protobuf::Arena::Create<absl::lts_20240722::Cord>(google::protobuf::Arena*)::_lambda((auto:1&&)___)_1_,google::protobuf::Arena::Create<absl::lts_20240722::Cord>(google::protobuf::Arena*)::_lambda((auto:1&&)___)_2_>
                         (&local_38,&local_40);
        this.data = (long)&msg->_vptr_MessageLite + (ulong)*(uint *)table_00;
        if ((this.data & 7) != 0) {
LAB_00157361:
          AlignFail(this.data);
        }
        *(anon_union_8_1_898a9ca8_for_TcFieldData_0 *)this = cord;
      }
    }
    else {
      cord.data = (long)&msg->_vptr_MessageLite + (ulong)*(uint *)table_00;
      this.data = cord.data;
      if ((cord.data & 7) != 0) goto LAB_00157361;
    }
    bVar1 = *ptr;
    if ((char)bVar1 < '\0') {
      table_01 = (TcParseTableBase *)(ulong)(uint)bVar1;
      pVar13 = ReadSizeFallback(ptr,(uint)bVar1);
      auVar4 = pVar13._0_12_;
      ctx_00 = pVar13._8_8_;
      if (pVar13.first == (char *)0x0) goto LAB_00157447;
    }
    else {
      auVar4[8] = bVar1;
      auVar4._0_8_ = ptr + 1;
      auVar4._9_3_ = 0;
    }
    table_01 = auVar4._0_8_;
    wire_bytes = ctx;
    ptr = EpsCopyInputStream::ReadCord
                    (&ctx->super_EpsCopyInputStream,(char *)table_01,auVar4._8_4_,(Cord *)cord);
    data.field_0 = cord;
    ctx_00 = entry;
    if ((ushort *)ptr == (ushort *)0x0) goto LAB_00157447;
    MpVerifyUtf8((Cord *)wire_bytes,table_01,(FieldEntry *)entry,local_54);
  }
  else {
    if ((uVar2 & 0x1c0) != 0) {
      Unreachable("/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_lite.cc"
                  ,0x8a0);
    }
    this.data = (long)&msg->_vptr_MessageLite + (ulong)*(uint *)table_00;
    if ((this.data & 7) != 0) goto LAB_00157361;
    if (bVar5 != false) {
      *(undefined8 **)this = &fixed_address_empty_string_abi_cxx11_;
    }
    data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)(msg->_internal_metadata_).ptr_;
    if (((ulong)data.field_0 & 1) != 0) {
      data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                     ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)
                     ((ulong)data.field_0 & 0xfffffffffffffffe))->data;
    }
    if (data.field_0.data == (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x0) {
      s = ArenaStringPtr::MutableNoCopy_abi_cxx11_((ArenaStringPtr *)this,(Arena *)0x0);
      puVar8 = (ushort *)InlineGreedyStringParser(s,ptr,ctx);
      ctx_00 = extraout_RDX_00;
      table_01 = (TcParseTableBase *)ptr;
    }
    else {
      puVar8 = (ushort *)
               EpsCopyInputStream::ReadArenaString
                         (&ctx->super_EpsCopyInputStream,ptr,(ArenaStringPtr *)this,
                          (Arena *)data.field_0);
      ctx_00 = extraout_RDX;
      table_01 = (TcParseTableBase *)ptr;
    }
    if (puVar8 == (ushort *)0x0) {
LAB_00157447:
      pcVar7 = Error(msg,(char *)table_01,ctx_00,data,table,hasbits);
      return pcVar7;
    }
    table_01 = *(TcParseTableBase **)(*(ulong *)this & 0xfffffffffffffffc);
    wire_bytes_00._M_str = (char *)table;
    wire_bytes_00._M_len = (size_t)table_01;
    bVar5 = MpVerifyUtf8((TcParser *)((undefined8 *)(*(ulong *)this & 0xfffffffffffffffc))[1],
                         wire_bytes_00,(TcParseTableBase *)table_00,(FieldEntry *)(ulong)local_54,
                         xform_val);
    data.field_0 = table_00;
    ctx_00 = extraout_RDX_01;
    ptr = (char *)puVar8;
    if (!bVar5) goto LAB_00157447;
  }
  if ((ctx->super_EpsCopyInputStream).limit_end_ <= ptr) {
    if ((ulong)table->has_bits_offset != 0) {
      puVar12 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
      if (((ulong)puVar12 & 3) != 0) {
        AlignFail(puVar12);
      }
      *puVar12 = *puVar12 | (uint)hasbits;
    }
    return (char *)(ushort *)ptr;
  }
  uVar6 = (uint)table->fast_idx_mask & (uint)*(ushort *)ptr;
  if ((uVar6 & 7) != 0) {
    protobuf_assumption_failed
              ("(idx & 7) == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_impl.h"
               ,0x44d);
  }
  uVar9 = (ulong)(uVar6 & 0xfffffff8);
  data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                 ((ulong)*(ushort *)ptr ^ *(ulong *)(&table[1].fast_idx_mask + uVar9 * 2));
  UNRECOVERED_JUMPTABLE = *(TailCallParseFunc *)(&table[1].has_bits_offset + uVar9);
LAB_0015725c:
  pcVar7 = (*UNRECOVERED_JUMPTABLE)(msg,ptr,ctx,data,table,hasbits);
  return pcVar7;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::MpString(PROTOBUF_TC_PARAM_DECL) {
  const auto& entry = RefAt<FieldEntry>(table, data.entry_offset());
  const uint16_t type_card = entry.type_card;
  const uint16_t card = type_card & field_layout::kFcMask;
  const uint32_t decoded_wiretype = data.tag() & 7;

  if (decoded_wiretype != WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
    PROTOBUF_MUSTTAIL return table->fallback(PROTOBUF_TC_PARAM_PASS);
  }
  if (card == field_layout::kFcRepeated) {
    PROTOBUF_MUSTTAIL return MpRepeatedString<is_split>(PROTOBUF_TC_PARAM_PASS);
  }
  const uint16_t xform_val = type_card & field_layout::kTvMask;
  const uint16_t rep = type_card & field_layout::kRepMask;

  // Mark the field as present:
  const bool is_oneof = card == field_layout::kFcOneof;
  bool need_init = false;
  if (card == field_layout::kFcOptional) {
    SetHas(entry, msg);
  } else if (is_oneof) {
    need_init = ChangeOneof(table, entry, data.tag() >> 3, ctx, msg);
  }

  bool is_valid = false;
  void* const base = MaybeGetSplitBase(msg, is_split, table);
  switch (rep) {
    case field_layout::kRepAString: {
      auto& field = RefAt<ArenaStringPtr>(base, entry.offset);
      if (need_init) field.InitDefault();
      Arena* arena = msg->GetArena();
      if (arena) {
        ptr = ctx->ReadArenaString(ptr, &field, arena);
      } else {
        std::string* str = field.MutableNoCopy(nullptr);
        ptr = InlineGreedyStringParser(str, ptr, ctx);
      }
      if (!ptr) break;
      is_valid = MpVerifyUtf8(field.Get(), table, entry, xform_val);
      break;
    }


    case field_layout::kRepCord: {
      absl::Cord* field;
      if (is_oneof) {
        if (need_init) {
          field = Arena::Create<absl::Cord>(msg->GetArena());
          RefAt<absl::Cord*>(msg, entry.offset) = field;
        } else {
          field = RefAt<absl::Cord*>(msg, entry.offset);
        }
      } else {
        field = &RefAt<absl::Cord>(base, entry.offset);
      }
      ptr = InlineCordParser(field, ptr, ctx);
      if (!ptr) break;
      is_valid = MpVerifyUtf8(*field, table, entry, xform_val);
      break;
    }

    default:
      Unreachable();
  }

  if (PROTOBUF_PREDICT_FALSE(ptr == nullptr || !is_valid)) {
    PROTOBUF_MUSTTAIL return Error(PROTOBUF_TC_PARAM_NO_DATA_PASS);
  }
  PROTOBUF_MUSTTAIL return ToTagDispatch(PROTOBUF_TC_PARAM_NO_DATA_PASS);
}